

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall google::protobuf::io::CodedInputStream::Refresh(CodedInputStream *this)

{
  bool bVar1;
  long *in_RDI;
  int buffer_size;
  void *void_buffer;
  int current_position;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  CodedInputStream *in_stack_ffffffffffffff20;
  void **in_stack_ffffffffffffff28;
  LogMessage *in_stack_ffffffffffffff30;
  CodedInputStream *in_stack_ffffffffffffff80;
  int local_74;
  DescriptorPool *local_70;
  bool local_1;
  
  if (((*(int *)((long)in_RDI + 0x2c) < 1) && (*(int *)((long)in_RDI + 0x1c) < 1)) &&
     ((int)in_RDI[3] != (int)in_RDI[5])) {
    bVar1 = anon_unknown_1::NextNonEmpty
                      ((ZeroCopyInputStream *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (int *)in_stack_ffffffffffffff20);
    if (bVar1) {
      *in_RDI = (long)local_70;
      in_RDI[1] = *in_RDI + (long)local_74;
      if (local_74 < 0) {
        in_stack_ffffffffffffff20 = (CodedInputStream *)&stack0xffffffffffffff50;
        internal::LogMessage::LogMessage
                  (in_stack_ffffffffffffff30,
                   (LogLevel_conflict)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                   (char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
        internal::LogMessage::operator<<
                  ((LogMessage *)in_stack_ffffffffffffff20,
                   (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        internal::LogFinisher::operator=
                  ((LogFinisher *)in_stack_ffffffffffffff20,
                   (LogMessage *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        internal::LogMessage::~LogMessage((LogMessage *)0x3c4dd1);
      }
      if (0x7fffffff - local_74 < (int)in_RDI[3]) {
        *(int *)((long)in_RDI + 0x1c) = (int)in_RDI[3] - (0x7fffffff - local_74);
        in_RDI[1] = in_RDI[1] - (long)*(int *)((long)in_RDI + 0x1c);
        *(undefined4 *)(in_RDI + 3) = 0x7fffffff;
      }
      else {
        *(int *)(in_RDI + 3) = local_74 + (int)in_RDI[3];
      }
      RecomputeBufferLimits(in_stack_ffffffffffffff20);
      local_1 = true;
    }
    else {
      *in_RDI = 0;
      in_RDI[1] = 0;
      local_1 = false;
    }
  }
  else {
    if (((int)in_RDI[6] <= (int)in_RDI[3] - *(int *)((long)in_RDI + 0x2c)) &&
       ((int)in_RDI[6] != (int)in_RDI[5])) {
      PrintTotalBytesLimitError(in_stack_ffffffffffffff80);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CodedInputStream::Refresh() {
  GOOGLE_DCHECK_EQ(0, BufferSize());

  if (buffer_size_after_limit_ > 0 || overflow_bytes_ > 0 ||
      total_bytes_read_ == current_limit_) {
    // We've hit a limit.  Stop.
    int current_position = total_bytes_read_ - buffer_size_after_limit_;

    if (current_position >= total_bytes_limit_ &&
        total_bytes_limit_ != current_limit_) {
      // Hit total_bytes_limit_.
      PrintTotalBytesLimitError();
    }

    return false;
  }

  const void* void_buffer;
  int buffer_size;
  if (NextNonEmpty(input_, &void_buffer, &buffer_size)) {
    buffer_ = reinterpret_cast<const uint8*>(void_buffer);
    buffer_end_ = buffer_ + buffer_size;
    GOOGLE_CHECK_GE(buffer_size, 0);

    if (total_bytes_read_ <= INT_MAX - buffer_size) {
      total_bytes_read_ += buffer_size;
    } else {
      // Overflow.  Reset buffer_end_ to not include the bytes beyond INT_MAX.
      // We can't get that far anyway, because total_bytes_limit_ is guaranteed
      // to be less than it.  We need to keep track of the number of bytes
      // we discarded, though, so that we can call input_->BackUp() to back
      // up over them on destruction.

      // The following line is equivalent to:
      //   overflow_bytes_ = total_bytes_read_ + buffer_size - INT_MAX;
      // except that it avoids overflows.  Signed integer overflow has
      // undefined results according to the C standard.
      overflow_bytes_ = total_bytes_read_ - (INT_MAX - buffer_size);
      buffer_end_ -= overflow_bytes_;
      total_bytes_read_ = INT_MAX;
    }

    RecomputeBufferLimits();
    return true;
  } else {
    buffer_ = NULL;
    buffer_end_ = NULL;
    return false;
  }
}